

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usd-export.cc
# Opt level: O0

bool tinyusdz::tydra::export_to_usda(RenderScene *scene,string *usda_str,string *warn,string *err)

{
  int iVar1;
  size_t sVar2;
  bool bVar3;
  bool bVar4;
  StageMetas *pSVar5;
  size_type sVar6;
  const_reference pvVar7;
  size_type sVar8;
  mapped_type *pmVar9;
  PrimMeta *pPVar10;
  value_type *pvVar11;
  size_type sVar12;
  reference prim_00;
  reference prim_01;
  reference ppVar13;
  pointer pTVar14;
  const_reference anim;
  ostream *poVar15;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args;
  string sStack_11d10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_11cf0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_11cd0;
  allocator aStack_11ca9;
  string asStack_11ca8 [32];
  string sStack_11c88;
  ostringstream aoStack_11c68 [8];
  ostringstream ss_e;
  allocator aStack_11ae9;
  string sStack_11ae8;
  undefined1 auStack_11ac8 [8];
  Prim matPrim;
  Model dummy;
  size_t i_2;
  Prim matGroupPrim;
  Scope matGroup;
  Prim prim;
  SkelAnimation skelAnim;
  size_t i_1;
  Prim animGroupPrim;
  Scope animGroup;
  Prim skelPrim;
  pair<const_unsigned_int,_tinyusdz::Skeleton> *item;
  iterator __end3;
  iterator __begin3;
  unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
  *__range3;
  Prim scopePrim;
  string local_c220 [32];
  undefined1 local_c200 [8];
  Scope scope;
  Prim subsetPrim;
  size_t s;
  Prim bsPrim;
  size_t t;
  Prim meshPrim;
  Relationship bsTargetRel;
  string local_a3d0;
  undefined1 local_a3b0 [8];
  Path targetPath;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a2c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a240;
  undefined1 local_a220 [8];
  string bs_path;
  undefined1 local_a1e0 [8];
  BlendShape bs;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>
  *target;
  const_iterator __end4;
  const_iterator __begin4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
  *__range4;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> bsTargetPaths;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> bsNames;
  vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> bss;
  value_type local_9588;
  APIName local_955c;
  value_type local_9558;
  undefined1 local_9530 [8];
  APISchemas skelAPISchema;
  string local_9508;
  string local_94e8;
  undefined1 local_94c8 [8];
  Path skelTargetPath;
  Relationship skelRel;
  value_type local_90e8;
  undefined1 local_90c0 [8];
  APISchemas skelAPISchema_1;
  Skeleton skel;
  undefined1 local_7450 [8];
  string src_animsource;
  SkelHierarchy *src_skel;
  string skel_name;
  uint32_t skel_id;
  undefined1 local_73f8 [3];
  bool has_skel;
  vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> subsets;
  GeomMesh mesh;
  size_t i;
  unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
  skelMap;
  undefined1 local_2a20 [7];
  bool has_skelroot;
  Prim skelRootPrim;
  string local_26c8;
  undefined1 local_26a8 [8];
  SkelRoot skelRoot;
  Axis local_16c0;
  allocator local_16b9;
  string local_16b8;
  undefined1 local_1698 [8];
  Stage stage;
  string *err_local;
  string *warn_local;
  string *usda_str_local;
  RenderScene *scene_local;
  
  stage._prim_id_allocator._32_8_ = err;
  Stage::Stage((Stage *)local_1698);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string((string *)&local_16b8,"Exported from TinyUSDZ Tydra.",&local_16b9);
  pSVar5 = Stage::metas((Stage *)local_1698);
  tinyusdz::value::StringData::operator=(&pSVar5->comment,&local_16b8);
  ::std::__cxx11::string::~string((string *)&local_16b8);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_16b9);
  bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &(scene->meta).upAxis,"X");
  if (bVar3) {
    local_16c0 = X;
    pSVar5 = Stage::metas((Stage *)local_1698);
    TypedAttributeWithFallback<tinyusdz::Axis>::operator=(&pSVar5->upAxis,&stack0xffffffffffffe940);
  }
  else {
    bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &(scene->meta).upAxis,"Y");
    if (bVar3) {
      skelRoot._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 1;
      pSVar5 = Stage::metas((Stage *)local_1698);
      TypedAttributeWithFallback<tinyusdz::Axis>::operator=
                (&pSVar5->upAxis,
                 (Axis *)((long)&skelRoot._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4));
    }
    else {
      bVar3 = ::std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&(scene->meta).upAxis,"Z");
      if (bVar3) {
        skelRoot._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 2;
        pSVar5 = Stage::metas((Stage *)local_1698);
        TypedAttributeWithFallback<tinyusdz::Axis>::operator=
                  (&pSVar5->upAxis,
                   (Axis *)&skelRoot._properties.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
      }
    }
  }
  SkelRoot::SkelRoot((SkelRoot *)local_26a8);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string
            ((string *)&local_26c8,"skelRoot",
             (allocator *)
             ((long)&skelRootPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  SkelRoot::set_name((SkelRoot *)local_26a8,&local_26c8);
  ::std::__cxx11::string::~string((string *)&local_26c8);
  ::std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&skelRootPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 7)
            );
  Prim::Prim<tinyusdz::SkelRoot>((Prim *)local_2a20,(SkelRoot *)local_26a8);
  skelMap._M_h._M_single_bucket._7_1_ = 0;
  ::std::
  unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
  ::unordered_map((unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                   *)&i);
  for (mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      sVar2 = mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count,
      sVar6 = ::std::
              vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
              size(&scene->meshes), sVar2 < sVar6;
      mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count =
           mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
    GeomMesh::GeomMesh((GeomMesh *)
                       &subsets.
                        super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage);
    ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::vector
              ((vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> *)local_73f8);
    pvVar7 = ::std::
             vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
             operator[](&scene->meshes,
                        mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
    bVar3 = detail::ToGeomMesh(scene,pvVar7,
                               (GeomMesh *)
                               &subsets.
                                super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                *)local_73f8,(string *)stage._prim_id_allocator._32_8_);
    if (bVar3) {
      bVar3 = false;
      pvVar7 = ::std::
               vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
               operator[](&scene->meshes,
                          mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      if (-1 < pvVar7->skel_id) {
        pvVar7 = ::std::
                 vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
                 operator[](&scene->meshes,
                            mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
        iVar1 = pvVar7->skel_id;
        sVar6 = ::std::
                vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                ::size(&scene->skeletons);
        if ((ulong)(long)iVar1 < sVar6) {
          pvVar7 = ::std::
                   vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                   ::operator[](&scene->meshes,
                                mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header.
                                _M_node_count);
          skel_name.field_2._12_4_ = pvVar7->skel_id;
          ::std::__cxx11::string::string((string *)&src_skel);
          sVar8 = ::std::
                  unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                  ::count((unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                           *)&i,(key_type *)(skel_name.field_2._M_local_buf + 0xc));
          if (sVar8 == 0) {
            pvVar7 = ::std::
                     vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>
                     ::operator[](&scene->meshes,
                                  mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header.
                                  _M_node_count);
            src_animsource.field_2._8_8_ =
                 ::std::
                 vector<tinyusdz::tydra::SkelHierarchy,_std::allocator<tinyusdz::tydra::SkelHierarchy>_>
                 ::operator[](&scene->skeletons,(long)pvVar7->skel_id);
            ::std::__cxx11::string::string((string *)local_7450);
            if (-1 < *(int *)(src_animsource.field_2._8_8_ + 0x1c0)) {
              ::std::vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
              ::operator[](&scene->animations,(long)*(int *)(src_animsource.field_2._8_8_ + 0x1c0));
              ::std::operator+((char *)&skel._properties.
                                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "/animations/");
              ::std::__cxx11::string::operator=
                        ((string *)local_7450,
                         (string *)
                         &skel._properties.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              ::std::__cxx11::string::~string
                        ((string *)
                         &skel._properties.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
            }
            Skeleton::Skeleton((Skeleton *)
                               &skelAPISchema_1.names.
                                super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar4 = detail::ExportSkeleton
                              ((SkelHierarchy *)src_animsource.field_2._8_8_,(string *)local_7450,
                               (Skeleton *)
                               &skelAPISchema_1.names.
                                super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,
                               (string *)stage._prim_id_allocator._32_8_);
            if (bVar4) {
              ::std::__cxx11::string::operator=
                        ((string *)&src_skel,(string *)(skel.super_Xformable._matrix.m[3] + 3));
              APISchemas::APISchemas((APISchemas *)local_90c0);
              local_90c0._0_4_ = Prepend;
              skelRel._772_4_ = 0x11;
              ::std::
              pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<tinyusdz::APISchemas::APIName,_const_char_(&)[1],_true>
                        ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_90e8,(APIName *)&skelRel.field_0x304,(char (*) [1])0xa0bae3);
              ::std::
              vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&skelAPISchema_1,&local_90e8);
              ::std::
              pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_90e8);
              pPVar10 = Skeleton::metas((Skeleton *)
                                        &skelAPISchema_1.names.
                                         super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
              nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                        (&pPVar10->apiSchemas,(APISchemas *)local_90c0);
              pmVar9 = ::std::
                       unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                       ::operator[]((unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                                     *)&i,(key_type *)(skel_name.field_2._M_local_buf + 0xc));
              Skeleton::operator=(pmVar9,(Skeleton *)
                                         &skelAPISchema_1.names.
                                          super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              APISchemas::~APISchemas((APISchemas *)local_90c0);
            }
            else {
              scene_local._7_1_ = 0;
            }
            bVar4 = !bVar4;
            Skeleton::~Skeleton((Skeleton *)
                                &skelAPISchema_1.names.
                                 super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            ::std::__cxx11::string::~string((string *)local_7450);
            if (!bVar4) goto LAB_0048793f;
          }
          else {
            pmVar9 = ::std::
                     unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                     ::operator[]((unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                                   *)&i,(key_type *)(skel_name.field_2._M_local_buf + 0xc));
            ::std::__cxx11::string::operator=((string *)&src_skel,(string *)&pmVar9->name);
LAB_0048793f:
            bVar3 = true;
            skelMap._M_h._M_single_bucket._7_1_ = 1;
            Relationship::Relationship((Relationship *)&skelTargetPath._valid);
            ::std::operator+((char *)&local_94e8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             "/skelRoot/");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_9508,"",
                       (allocator *)
                       ((long)&skelAPISchema.names.
                               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            Path::Path((Path *)local_94c8,&local_94e8,&local_9508);
            ::std::__cxx11::string::~string((string *)&local_9508);
            ::std::allocator<char>::~allocator
                      ((allocator<char> *)
                       ((long)&skelAPISchema.names.
                               super__Vector_base<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
            ::std::__cxx11::string::~string((string *)&local_94e8);
            Relationship::set((Relationship *)&skelTargetPath._valid,(Path *)local_94c8);
            nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                      ((optional<tinyusdz::Relationship> *)&mesh.faceVertexIndices._blocked,
                       (Relationship *)&skelTargetPath._valid);
            APISchemas::APISchemas((APISchemas *)local_9530);
            local_9530._0_4_ = Prepend;
            local_955c = SkelBindingAPI;
            ::std::
            pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::pair<tinyusdz::APISchemas::APIName,_const_char_(&)[1],_true>
                      ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_9558,&local_955c,(char (*) [1])0xa0bae3);
            ::std::
            vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)&skelAPISchema,&local_9558);
            ::std::
            pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)&local_9558);
            pPVar10 = GPrim::metas((GPrim *)&subsets.
                                             super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
            bVar4 = nonstd::optional_lite::optional::operator_cast_to_bool
                              ((optional *)&pPVar10->apiSchemas);
            if (bVar4) {
              pPVar10 = GPrim::metas((GPrim *)&subsets.
                                               super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              pvVar11 = nonstd::optional_lite::optional<tinyusdz::APISchemas>::value
                                  (&pPVar10->apiSchemas);
              bss.super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0x11;
              ::std::
              pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::pair<tinyusdz::APISchemas::APIName,_const_char_(&)[1],_true>
                        ((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_9588,
                         (APIName *)
                         ((long)&bss.
                                 super__Vector_base<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage + 4),
                         (char (*) [1])0xa0bae3);
              ::std::
              vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::push_back((vector<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)&pvVar11->names,&local_9588);
              ::std::
              pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::~pair((pair<tinyusdz::APISchemas::APIName,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       *)&local_9588);
            }
            else {
              pPVar10 = GPrim::metas((GPrim *)&subsets.
                                               super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                               ._M_impl.super__Vector_impl_data._M_end_of_storage);
              nonstd::optional_lite::optional<tinyusdz::APISchemas>::operator=
                        (&pPVar10->apiSchemas,(APISchemas *)local_9530);
            }
            APISchemas::~APISchemas((APISchemas *)local_9530);
            Path::~Path((Path *)local_94c8);
            Relationship::~Relationship((Relationship *)&skelTargetPath._valid);
            bVar4 = false;
          }
          ::std::__cxx11::string::~string((string *)&src_skel);
          if (bVar4) goto LAB_0048821c;
        }
      }
      ::std::vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>::vector
                ((vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> *)
                 &bsNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar7 = ::std::
               vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
               operator[](&scene->meshes,
                          mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      sVar12 = ::std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
               ::size(&pvVar7->targets);
      if (sVar12 == 0) {
LAB_00487f3a:
        Prim::Prim<tinyusdz::GeomMesh>
                  ((Prim *)&t,
                   (GeomMesh *)
                   &subsets.
                    super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        sVar6 = ::std::vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>::size
                          ((vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> *)
                           &bsNames.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
        if (sVar6 != 0) {
          for (bsPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              sVar2 = bsPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
              sVar6 = ::std::vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>::
                      size((vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> *)
                           &bsNames.
                            super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage), sVar2 < sVar6;
              bsPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   bsPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
            prim_00 = ::std::vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>::
                      operator[]((vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>
                                  *)&bsNames.
                                     super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 bsPrim._variantSets._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
            Prim::Prim<tinyusdz::BlendShape>((Prim *)&s,prim_00);
            bVar4 = Prim::add_child((Prim *)&t,(Prim *)&s,false,
                                    (string *)stage._prim_id_allocator._32_8_);
            if (!bVar4) {
              scene_local._7_1_ = 0;
            }
            bVar4 = !bVar4;
            Prim::~Prim((Prim *)&s);
            if (bVar4) goto LAB_00488204;
          }
        }
        sVar6 = ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::size
                          ((vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> *)
                           local_73f8);
        if (sVar6 != 0) {
          for (subsetPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
              sVar6 = ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::
                      size((vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> *)
                           local_73f8),
              subsetPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count < sVar6;
              subsetPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count =
                   subsetPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count + 1) {
            prim_01 = ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::
                      operator[]((vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                                  *)local_73f8,
                                 subsetPrim._variantSets._M_t._M_impl.super__Rb_tree_header.
                                 _M_node_count);
            Prim::Prim<tinyusdz::GeomSubset>
                      ((Prim *)&scope._properties.
                                super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage,prim_01);
            bVar4 = Prim::add_child((Prim *)&t,
                                    (Prim *)&scope._properties.
                                             super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                             ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                    false,(string *)stage._prim_id_allocator._32_8_);
            if (!bVar4) {
              scene_local._7_1_ = 0;
            }
            bVar4 = !bVar4;
            Prim::~Prim((Prim *)&scope._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
            if (bVar4) goto LAB_00488204;
          }
        }
        if (bVar3) {
          Prim::add_child((Prim *)local_2a20,(Prim *)&t,false,(string *)0x0);
        }
        else {
          Scope::Scope((Scope *)local_c200);
          ::std::__cxx11::to_string
                    ((string *)
                     &scopePrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                     mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header._M_node_count);
          ::std::operator+((char *)local_c220,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           "scope");
          ::std::__cxx11::string::operator=
                    ((string *)
                     &scope.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
                      super__Rb_tree_header._M_node_count,local_c220);
          ::std::__cxx11::string::~string(local_c220);
          ::std::__cxx11::string::~string
                    ((string *)
                     &scopePrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
          Prim::Prim<tinyusdz::Scope>((Prim *)&__range3,(Scope *)local_c200);
          Prim::add_child((Prim *)&__range3,(Prim *)&t,true,(string *)0x0);
          Stage::add_root_prim((Stage *)local_1698,(Prim *)&__range3,true);
          Prim::~Prim((Prim *)&__range3);
          Scope::~Scope((Scope *)local_c200);
        }
        bVar4 = false;
LAB_00488204:
        Prim::~Prim((Prim *)&t);
      }
      else {
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &bsTargetPaths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&__range4);
        pvVar7 = ::std::
                 vector<tinyusdz::tydra::RenderMesh,_std::allocator<tinyusdz::tydra::RenderMesh>_>::
                 operator[](&scene->meshes,
                            mesh.subsetFamilyTypeMap._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
        __end4 = ::std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
                 ::begin(&pvVar7->targets);
        target = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>
                  *)::std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>_>
                    ::end(&pvVar7->targets);
        while (bVar4 = ::std::operator!=(&__end4,(_Self *)&target), bVar4) {
          bs._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)::std::
                        _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>
                        ::operator*(&__end4);
          BlendShape::BlendShape((BlendShape *)local_a1e0);
          bVar4 = detail::ExportBlendShape
                            ((ShapeTarget *)
                             (bs._properties.
                              super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 1),
                             (BlendShape *)local_a1e0,(string *)stage._prim_id_allocator._32_8_);
          if (bVar4) {
            ::std::vector<tinyusdz::BlendShape,std::allocator<tinyusdz::BlendShape>>::
            emplace_back<tinyusdz::BlendShape&>
                      ((vector<tinyusdz::BlendShape,std::allocator<tinyusdz::BlendShape>> *)
                       &bsNames.
                        super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage,(BlendShape *)local_a1e0);
            Token::Token((Token *)((long)&bs_path.field_2 + 8),
                         &(bs._properties.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage)->str_);
            ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::push_back
                      ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                       &bsTargetPaths.
                        super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (value_type *)((long)&bs_path.field_2 + 8));
            Token::~Token((Token *)((long)&bs_path.field_2 + 8));
            ::std::__cxx11::string::string((string *)local_a220);
            if (bVar3) {
              ::std::operator+((char *)&local_a280,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               "/skelRoot/");
              ::std::operator+(&local_a260,&local_a280,"/");
              ::std::operator+(&local_a240,&local_a260,
                               &(bs._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->str_);
              ::std::__cxx11::string::operator=((string *)local_a220,(string *)&local_a240);
              ::std::__cxx11::string::~string((string *)&local_a240);
              ::std::__cxx11::string::~string((string *)&local_a260);
              ::std::__cxx11::string::~string((string *)&local_a280);
            }
            else {
              ::std::operator+(&targetPath._valid,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               0x9de871);
              ::std::operator+(&local_a2c0,
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               &targetPath._valid,"/");
              ::std::operator+(&local_a2a0,&local_a2c0,
                               &(bs._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage)->str_);
              ::std::__cxx11::string::operator=((string *)local_a220,(string *)&local_a2a0);
              ::std::__cxx11::string::~string((string *)&local_a2a0);
              ::std::__cxx11::string::~string((string *)&local_a2c0);
              ::std::__cxx11::string::~string((string *)&targetPath._valid);
            }
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string
                      ((string *)&local_a3d0,"",(allocator *)&bsTargetRel.field_0x307);
            Path::Path((Path *)local_a3b0,(string *)local_a220,&local_a3d0);
            ::std::__cxx11::string::~string((string *)&local_a3d0);
            ::std::allocator<char>::~allocator((allocator<char> *)&bsTargetRel.field_0x307);
            ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::push_back
                      ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&__range4,
                       (value_type *)local_a3b0);
            Path::~Path((Path *)local_a3b0);
            ::std::__cxx11::string::~string((string *)local_a220);
            bVar4 = false;
          }
          else {
            scene_local._7_1_ = 0;
            bVar4 = true;
          }
          BlendShape::~BlendShape((BlendShape *)local_a1e0);
          if (bVar4) goto LAB_00487f10;
          ::std::
          _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::tydra::ShapeTarget>_>
          ::operator++(&__end4);
        }
        Relationship::Relationship
                  ((Relationship *)
                   &meshPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        Relationship::set((Relationship *)
                          &meshPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                          (vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&__range4);
        nonstd::optional_lite::optional<tinyusdz::Relationship>::operator=
                  ((optional<tinyusdz::Relationship> *)&mesh.blendShapes._blocked,
                   (Relationship *)
                   &meshPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::set_value
                  ((TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                    *)&mesh.faceVaryingLinearInterpolation._blocked,
                   (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &bsTargetPaths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        Relationship::~Relationship
                  ((Relationship *)
                   &meshPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
        bVar4 = false;
LAB_00487f10:
        ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::~vector
                  ((vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> *)&__range4);
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                   &bsTargetPaths.
                    super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
        if (!bVar4) goto LAB_00487f3a;
      }
      ::std::vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_>::~vector
                ((vector<tinyusdz::BlendShape,_std::allocator<tinyusdz::BlendShape>_> *)
                 &bsNames.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      scene_local._7_1_ = 0;
      bVar4 = true;
    }
LAB_0048821c:
    ::std::vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>::~vector
              ((vector<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_> *)local_73f8);
    GeomMesh::~GeomMesh((GeomMesh *)
                        &subsets.
                         super__Vector_base<tinyusdz::GeomSubset,_std::allocator<tinyusdz::GeomSubset>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar4) goto LAB_00488835;
  }
  if ((skelMap._M_h._M_single_bucket._7_1_ & 1) != 0) {
    __end3 = ::std::
             unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
             ::begin((unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                      *)&i);
    item = (pair<const_unsigned_int,_tinyusdz::Skeleton> *)
           ::std::
           unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
           ::end((unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                  *)&i);
    while (bVar3 = ::std::__detail::operator!=
                             (&__end3.
                               super__Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_false>
                              ,(_Node_iterator_base<std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_false>
                                *)&item), bVar3) {
      ppVar13 = ::std::__detail::
                _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_false,_false>::
                operator*(&__end3);
      Prim::Prim<tinyusdz::Skeleton>
                ((Prim *)&animGroup._properties.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,&ppVar13->second);
      Prim::add_child((Prim *)local_2a20,
                      (Prim *)&animGroup._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,false,
                      (string *)0x0);
      Prim::~Prim((Prim *)&animGroup._properties.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
      ::std::__detail::
      _Node_iterator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>,_false,_false>::operator++
                (&__end3);
    }
    Stage::add_root_prim((Stage *)local_1698,(Prim *)local_2a20,true);
  }
  Scope::Scope((Scope *)&animGroupPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count
              );
  ::std::__cxx11::string::operator=
            ((string *)
             &animGroup.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
              super__Rb_tree_header._M_node_count,"animations");
  Prim::Prim<tinyusdz::Scope>
            ((Prim *)&i_1,
             (Scope *)&animGroupPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
  for (skelAnim._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
       _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      pTVar14 = (pointer)::std::
                         vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>
                         ::size(&scene->animations),
      skelAnim._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage < pTVar14;
      skelAnim._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)&((skelAnim._properties.
                       super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl
                       .super__Vector_impl_data._M_end_of_storage)->str_).field_0x1) {
    SkelAnimation::SkelAnimation
              ((SkelAnimation *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    anim = ::std::vector<tinyusdz::tydra::Animation,_std::allocator<tinyusdz::tydra::Animation>_>::
           operator[](&scene->animations,
                      (size_type)
                      skelAnim._properties.
                      super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
    bVar3 = detail::ExportSkelAnimation
                      (anim,(SkelAnimation *)
                            &prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count,
                       (string *)stage._prim_id_allocator._32_8_);
    if (bVar3) {
      Prim::Prim<tinyusdz::SkelAnimation>
                ((Prim *)&matGroup._properties.
                          super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (SkelAnimation *)
                 &prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Prim::add_child((Prim *)&i_1,
                      (Prim *)&matGroup._properties.
                               super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,true,(string *)0x0
                     );
      Prim::~Prim((Prim *)&matGroup._properties.
                           super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage);
    }
    else {
      scene_local._7_1_ = 0;
    }
    bVar3 = !bVar3;
    SkelAnimation::~SkelAnimation
              ((SkelAnimation *)&prim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    if (bVar3) goto LAB_00488483;
  }
  Stage::add_root_prim((Stage *)local_1698,(Prim *)&i_1,true);
  bVar3 = false;
LAB_00488483:
  Prim::~Prim((Prim *)&i_1);
  Scope::~Scope((Scope *)&animGroupPrim._variantSets._M_t._M_impl.super__Rb_tree_header.
                          _M_node_count);
  if (!bVar3) {
    Scope::Scope((Scope *)&matGroupPrim._variantSets._M_t._M_impl.super__Rb_tree_header.
                           _M_node_count);
    ::std::__cxx11::string::operator=
              ((string *)
               &matGroup.super_MaterialBinding._materialBindingCollectionMap._M_t._M_impl.
                super__Rb_tree_header._M_node_count,"materials");
    Prim::Prim<tinyusdz::Scope>
              ((Prim *)&i_2,
               (Scope *)&matGroupPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count)
    ;
    for (dummy._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        pTVar14 = (pointer)::std::
                           vector<tinyusdz::tydra::RenderMaterial,_std::allocator<tinyusdz::tydra::RenderMaterial>_>
                           ::size(&scene->materials),
        dummy._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage < pTVar14;
        dummy._properties.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)&((dummy._properties.
                         super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage)->str_).field_0x1) {
      Model::Model((Model *)&matPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      Prim::Prim<tinyusdz::Model>
                ((Prim *)auStack_11ac8,
                 (Model *)&matPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string((string *)&sStack_11ae8,"/materials",&aStack_11ae9);
      bVar3 = detail::ToMaterialPrim
                        (scene,&sStack_11ae8,
                         (size_t)dummy._properties.
                                 super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (Prim *)auStack_11ac8,(string *)stage._prim_id_allocator._32_8_);
      ::std::__cxx11::string::~string((string *)&sStack_11ae8);
      ::std::allocator<char>::~allocator((allocator<char> *)&aStack_11ae9);
      if (((bVar3 ^ 0xffU) & 1) == 0) {
        args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
               stage._prim_id_allocator._32_8_;
        bVar3 = Prim::add_child((Prim *)&i_2,(Prim *)auStack_11ac8,false,
                                (string *)stage._prim_id_allocator._32_8_);
        if (bVar3) {
          bVar3 = false;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream(aoStack_11c68);
          poVar15 = ::std::operator<<((ostream *)aoStack_11c68,"[error]");
          poVar15 = ::std::operator<<(poVar15,
                                      "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/tydra/usd-export.cc"
                                     );
          poVar15 = ::std::operator<<(poVar15,":");
          poVar15 = ::std::operator<<(poVar15,"export_to_usda");
          poVar15 = ::std::operator<<(poVar15,"():");
          poVar15 = (ostream *)::std::ostream::operator<<(poVar15,0x5ab);
          ::std::operator<<(poVar15," ");
          ::std::allocator<char>::allocator();
          ::std::__cxx11::string::string(asStack_11ca8,"Failed to add child Prim: {}",&aStack_11ca9)
          ;
          fmt::format<std::__cxx11::string*>
                    (&sStack_11c88,(fmt *)asStack_11ca8,(string *)&stage._prim_id_allocator.dirty_,
                     args);
          poVar15 = ::std::operator<<((ostream *)aoStack_11c68,(string *)&sStack_11c88);
          ::std::operator<<(poVar15,"\n");
          ::std::__cxx11::string::~string((string *)&sStack_11c88);
          ::std::__cxx11::string::~string(asStack_11ca8);
          ::std::allocator<char>::~allocator((allocator<char> *)&aStack_11ca9);
          if (stage._prim_id_allocator._32_8_ != 0) {
            ::std::__cxx11::ostringstream::str();
            ::std::operator+(&bStack_11cd0,&bStack_11cf0,"\n");
            ::std::__cxx11::string::operator+=
                      ((string *)stage._prim_id_allocator._32_8_,(string *)&bStack_11cd0);
            ::std::__cxx11::string::~string((string *)&bStack_11cd0);
            ::std::__cxx11::string::~string((string *)&bStack_11cf0);
          }
          scene_local._7_1_ = 0;
          bVar3 = true;
          ::std::__cxx11::ostringstream::~ostringstream(aoStack_11c68);
        }
      }
      else {
        scene_local._7_1_ = 0;
        bVar3 = true;
      }
      Prim::~Prim((Prim *)auStack_11ac8);
      Model::~Model((Model *)&matPrim._variantSets._M_t._M_impl.super__Rb_tree_header._M_node_count)
      ;
      if (bVar3) goto LAB_004887d2;
    }
    Stage::add_root_prim((Stage *)local_1698,(Prim *)&i_2,true);
    bVar3 = false;
LAB_004887d2:
    Prim::~Prim((Prim *)&i_2);
    Scope::~Scope((Scope *)&matGroupPrim._variantSets._M_t._M_impl.super__Rb_tree_header.
                            _M_node_count);
    if (!bVar3) {
      Stage::ExportToString_abi_cxx11_(&sStack_11d10,(Stage *)local_1698,false);
      ::std::__cxx11::string::operator=((string *)usda_str,(string *)&sStack_11d10);
      ::std::__cxx11::string::~string((string *)&sStack_11d10);
      scene_local._7_1_ = 1;
    }
  }
LAB_00488835:
  ::std::
  unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
  ::~unordered_map((unordered_map<unsigned_int,_tinyusdz::Skeleton,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_tinyusdz::Skeleton>_>_>
                    *)&i);
  Prim::~Prim((Prim *)local_2a20);
  SkelRoot::~SkelRoot((SkelRoot *)local_26a8);
  Stage::~Stage((Stage *)local_1698);
  return (bool)(scene_local._7_1_ & 1);
}

Assistant:

bool export_to_usda(const RenderScene &scene,
  std::string &usda_str, std::string *warn, std::string *err) {

  (void)warn;

  Stage stage;

  stage.metas().comment = "Exported from TinyUSDZ Tydra.";
  if (scene.meta.upAxis == "X") {
    stage.metas().upAxis = Axis::X;
  } else if (scene.meta.upAxis == "Y") {
    stage.metas().upAxis = Axis::Y;
  } else if (scene.meta.upAxis == "Z") {
    stage.metas().upAxis = Axis::Z;
  }

  SkelRoot skelRoot;
  skelRoot.set_name("skelRoot"); 
  Prim skelRootPrim(skelRoot);

  bool has_skelroot{false};

  // TODO: Construct Node hierarchy

  std::unordered_map<uint32_t, Skeleton> skelMap;

  for (size_t i = 0; i < scene.meshes.size(); i++) {
    GeomMesh mesh;
    std::vector<GeomSubset> subsets;
    if (!detail::ToGeomMesh(scene, scene.meshes[i], &mesh, &subsets, err)) {
      return false;
    }

    bool has_skel{false};

    if ((scene.meshes[i].skel_id > -1) && (size_t(scene.meshes[i].skel_id) < scene.skeletons.size())) {
      DCOUT("Export Skeleton");

      uint32_t skel_id = uint32_t(scene.meshes[i].skel_id);
      std::string skel_name;
      if (!skelMap.count(skel_id)) {
        const SkelHierarchy &src_skel = scene.skeletons[size_t(scene.meshes[i].skel_id)];

        std::string src_animsource; // empty = no animationSource
        if (src_skel.anim_id > -1) {
          src_animsource = "/animations/" + scene.animations[size_t(src_skel.anim_id)].prim_name;
        }

        Skeleton skel;
        if (!detail::ExportSkeleton(src_skel, src_animsource, &skel, err)) {
          return false;
        }
        skel_name = skel.name;

        APISchemas skelAPISchema;
        skelAPISchema.listOpQual = ListEditQual::Prepend;
        skelAPISchema.names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
        skel.metas().apiSchemas = skelAPISchema;

        skelMap[skel_id] = std::move(skel);
      } else {
        skel_name = skelMap[skel_id].name;
      }

      has_skel = true;
      has_skelroot = true;

      // Add some skel settings to GeomMesh.
      
      // rel skel:skeleton
      Relationship skelRel;
      // FIXME: Set abs_path 
      Path skelTargetPath("/skelRoot/" + skel_name, "");
      skelRel.set(skelTargetPath);
      mesh.skeleton = skelRel;

    
      // Add apiSchemas both for GeomMesh and Skeleton
      //
      // prepend apiSchemas = ["SkelBindingAPI"]
      //
      APISchemas skelAPISchema;
      skelAPISchema.listOpQual = ListEditQual::Prepend;
      skelAPISchema.names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
      if (mesh.metas().apiSchemas) {
        // Assume existing apiSchemas uses prepend listEditOp.
        mesh.metas().apiSchemas.value().names.push_back({APISchemas::APIName::SkelBindingAPI, ""});
      } else {
        mesh.metas().apiSchemas = skelAPISchema;
      }

    }

    std::vector<BlendShape> bss;
    if (scene.meshes[i].targets.size()) {

      std::vector<value::token> bsNames;
      std::vector<Path> bsTargetPaths;

      for (const auto &target : scene.meshes[i].targets) {
        BlendShape bs;
        if (!detail::ExportBlendShape(target.second, &bs, err)) {
          return false;
        }

        bss.emplace_back(bs);
        bsNames.push_back(value::token(target.first));
        // TODO: Set abs_path
        std::string bs_path;
        if (has_skel) {
          bs_path = "/skelRoot/" + mesh.name + "/" + target.first;
        } else {
          bs_path = "/" + mesh.name + "/" + target.first;
        }
        Path targetPath = Path(bs_path, "");
        bsTargetPaths.push_back(targetPath);
      }

      Relationship bsTargetRel;
      bsTargetRel.set(bsTargetPaths);

      mesh.blendShapeTargets = bsTargetRel;
      mesh.blendShapes.set_value(bsNames);

    }

    Prim meshPrim(mesh);

    // Add BlendShape prim under GeomMesh prim.
    if (bss.size()) {
      for (size_t t = 0; t < bss.size(); t++) {
        Prim bsPrim(bss[t]);
        if (!meshPrim.add_child(std::move(bsPrim), /* rename_primname_if_requred */false, err)) {
          return false;
        }
      }
    }

    // Add GeomSubset prim under GeomMesh prim.
    if (subsets.size()) {
      for (size_t s = 0; s < subsets.size(); s++) {
        Prim subsetPrim(subsets[s]);
        if (!meshPrim.add_child(std::move(subsetPrim), /* rename_primname_if_required */false, err)) {
          return false;
        }
      }
    }

    if (has_skel) {

      skelRootPrim.add_child(std::move(meshPrim), /* rename_primname_if_require */false);

    } else {
      // Put Prims under Scope Prim
      Scope scope;
      scope.name = "scope" + std::to_string(i);

      Prim scopePrim(scope);
      scopePrim.add_child(std::move(meshPrim));

      stage.add_root_prim(std::move(scopePrim));
    }

  }

  if (has_skelroot) {

    for (const auto &item : skelMap) {
      Prim skelPrim(item.second);
      skelRootPrim.add_child(std::move(skelPrim), /* rename_primname_if_require */false);
    }

    stage.add_root_prim(std::move(skelRootPrim));
  }

  // TODO: Move to SkelRoot
  {
    Scope animGroup;
    animGroup.name = "animations";

    Prim animGroupPrim(animGroup);

    for (size_t i = 0; i < scene.animations.size(); i++) {
      SkelAnimation skelAnim;
      if (!detail::ExportSkelAnimation(scene.animations[i], &skelAnim, err)) {
        return false;
      }

      // TODO: Put SkelAnimation under SkelRoot
      Prim prim(skelAnim);
      animGroupPrim.add_child(std::move(prim));
    }
    stage.add_root_prim(std::move(animGroupPrim));
  }

  {
    Scope matGroup;
    matGroup.name = "materials";

    Prim matGroupPrim(matGroup);

    DCOUT("export " << scene.materials.size() << " materials");

    for (size_t i = 0; i < scene.materials.size(); i++) {
      // init with dummy object(Model Prim)
      Model dummy;
      Prim matPrim(std::move(dummy));  
      if (!detail::ToMaterialPrim(scene, "/materials", i, &matPrim, err)) {
        return false;
      }
      if (!matGroupPrim.add_child(std::move(matPrim), /* rename_primname_if_required */false, err)) {
        PUSH_ERROR_AND_RETURN(fmt::format("Failed to add child Prim: {}", err));
      }
      
    }
    stage.add_root_prim(std::move(matGroupPrim));
  }

  usda_str =stage.ExportToString();

  return true;
}